

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc_get_position.c
# Opt level: O0

void parse(char *txt)

{
  char cVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *in_RDI;
  uint8_t t;
  la_adsc_tag_t *tag_struct;
  la_adsc_basic_report_t *rpt;
  la_list *l;
  la_adsc_msg_t *msg;
  la_proto_node *adsc_node;
  la_proto_node *node;
  int offset;
  undefined8 *local_38;
  undefined8 *local_30;
  
  sVar4 = strlen(in_RDI);
  iVar3 = la_acars_extract_sublabel_and_mfi("H1",2,in_RDI,sVar4 & 0xffffffff,0);
  lVar5 = la_arinc_parse(in_RDI + iVar3,2);
  printf("%s\n",in_RDI);
  if (lVar5 == 0) {
    printf("-- Failed to decode message\n");
  }
  else {
    lVar6 = la_proto_tree_find_adsc(lVar5);
    if (lVar6 == 0) {
      printf("-- Not an ADS-C message\n");
    }
    else {
      pbVar2 = *(byte **)(lVar6 + 8);
      if ((*pbVar2 & 1) == 1) {
        printf("-- Malformed ADS-C message\n");
      }
      local_30 = *(undefined8 **)(pbVar2 + 8);
      local_38 = (undefined8 *)0x0;
      for (; local_30 != (undefined8 *)0x0; local_30 = (undefined8 *)la_list_next(local_30)) {
        cVar1 = *(char *)*local_30;
        if ((((cVar1 == '\a') || (cVar1 == '\t')) || (cVar1 == '\n')) ||
           (((cVar1 == '\x12' || (cVar1 == '\x13')) || (cVar1 == '\x14')))) {
          local_38 = *(undefined8 **)((char *)*local_30 + 0x10);
          break;
        }
      }
      if (local_38 == (undefined8 *)0x0) {
        printf("-- Message does not contain an ADS-C Basic Report\n");
      }
      else {
        printf(" Latitude: %f\n Longitude: %f\n Altitude: %d ft\n Timestamp: %f seconds past hour\n"
               ,*local_38,local_38[1],local_38[2],(ulong)*(uint *)(local_38 + 3));
      }
    }
    la_proto_tree_destroy(lVar5);
  }
  return;
}

Assistant:

void parse(char *txt) {
	// Skip sublabel and MFI if present, la_arinc_parse does not want them.
	int offset = la_acars_extract_sublabel_and_mfi("H1", LA_MSG_DIR_AIR2GND,
			txt, strlen(txt), NULL, NULL);
	// Parse the message and build the protocol tree
	la_proto_node *node = la_arinc_parse(txt + offset, LA_MSG_DIR_AIR2GND);
	printf("%s\n", txt);
	if(node == NULL) {
		printf("-- Failed to decode message\n");
		return;
	}
	// Walk the tree and find out if there is an ADS-C message in it.
	// If there is, adsc_node will point at its node in the tree.
	la_proto_node *adsc_node = la_proto_tree_find_adsc(node);
	if(adsc_node == NULL) {
		printf("-- Not an ADS-C message\n");
		goto cleanup;
	}
	la_adsc_msg_t *msg = (la_adsc_msg_t *)adsc_node->data;
	// Print a warning if the decoder has raised an error flag.
	// The flag means that the message decoding has failed, at least partially.
	// For example, it might have been an uplink message (while we expect
	// a downlink) or it might have been truncated (decoded partially).
	// We don't fail here, hoping for the second case - if basic report tag
	// has been decoded correctly, we might get a good position.
	if(msg->err == true) {
		printf("-- Malformed ADS-C message\n");
	}
	la_list *l = msg->tag_list;
	la_adsc_basic_report_t *rpt = NULL;
	// We have a good ADS-C message.
	// Now walk the list of tags and find out if it contains a Basic Report tag
	// (this is where coordinates are found).
	while(l != NULL) {
		la_adsc_tag_t *tag_struct = (la_adsc_tag_t *)l->data;
		uint8_t t = tag_struct->tag;
		// These tags contain a Basic Report
		if(t == 7 || t == 9 || t == 10 || t == 18 || t == 19 || t == 20) {
			rpt = (la_adsc_basic_report_t *)tag_struct->data;
			break;
		}
		l = la_list_next(l);
	}
	if(rpt == NULL) {
		printf("-- Message does not contain an ADS-C Basic Report\n");
		goto cleanup;
	}
	// We have found a Basic Report - print some fields from it.
	printf(" Latitude: %f\n Longitude: %f\n Altitude: %d ft\n Timestamp: %f seconds past hour\n",
			rpt->lat, rpt->lon, rpt->alt, rpt->timestamp);
cleanup:
	la_proto_tree_destroy(node);
}